

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.h
# Opt level: O0

int MIR_FP_branch_code_p(MIR_insn_code_t code)

{
  undefined1 local_d;
  MIR_insn_code_t code_local;
  
  local_d = true;
  if (((((((code != MIR_FBEQ) && (local_d = true, code != MIR_DBEQ)) &&
         (local_d = true, code != MIR_LDBEQ)) &&
        ((local_d = true, code != MIR_FBNE && (local_d = true, code != MIR_DBNE)))) &&
       ((local_d = true, code != MIR_LDBNE &&
        ((local_d = true, code != MIR_FBLT && (local_d = true, code != MIR_DBLT)))))) &&
      (local_d = true, code != MIR_LDBLT)) &&
     ((((local_d = true, code != MIR_FBLE && (local_d = true, code != MIR_DBLE)) &&
       (local_d = true, code != MIR_LDBLE)) &&
      (((local_d = true, code != MIR_FBGT && (local_d = true, code != MIR_DBGT)) &&
       ((local_d = true, code != MIR_LDBGT &&
        ((local_d = true, code != MIR_FBGE && (local_d = true, code != MIR_DBGE)))))))))) {
    local_d = code == MIR_LDBGE;
  }
  return (int)local_d;
}

Assistant:

static inline int MIR_FP_branch_code_p (MIR_insn_code_t code) {
  return (code == MIR_FBEQ || code == MIR_DBEQ || code == MIR_LDBEQ || code == MIR_FBNE
          || code == MIR_DBNE || code == MIR_LDBNE || code == MIR_FBLT || code == MIR_DBLT
          || code == MIR_LDBLT || code == MIR_FBLE || code == MIR_DBLE || code == MIR_LDBLE
          || code == MIR_FBGT || code == MIR_DBGT || code == MIR_LDBGT || code == MIR_FBGE
          || code == MIR_DBGE || code == MIR_LDBGE);
}